

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O1

bool __thiscall
ViconCGStreamIO::VBuffer::Read<ViconCGStreamDetail::VCameraCalibrationHealth_Camera>
          (VBuffer *this,
          vector<ViconCGStreamDetail::VCameraCalibrationHealth_Camera,_std::allocator<ViconCGStreamDetail::VCameraCalibrationHealth_Camera>_>
          *o_rValues)

{
  uint uVar1;
  uint uVar2;
  pointer pVVar3;
  pointer puVar4;
  bool bVar5;
  bool bVar6;
  VCameraCalibrationHealth_Camera *this_00;
  ulong __new_size;
  
  pVVar3 = (o_rValues->
           super__Vector_base<ViconCGStreamDetail::VCameraCalibrationHealth_Camera,_std::allocator<ViconCGStreamDetail::VCameraCalibrationHealth_Camera>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((o_rValues->
      super__Vector_base<ViconCGStreamDetail::VCameraCalibrationHealth_Camera,_std::allocator<ViconCGStreamDetail::VCameraCalibrationHealth_Camera>_>
      )._M_impl.super__Vector_impl_data._M_finish != pVVar3) {
    (o_rValues->
    super__Vector_base<ViconCGStreamDetail::VCameraCalibrationHealth_Camera,_std::allocator<ViconCGStreamDetail::VCameraCalibrationHealth_Camera>_>
    )._M_impl.super__Vector_impl_data._M_finish = pVVar3;
  }
  uVar1 = (this->m_BufferImpl).m_Offset;
  puVar4 = (this->m_BufferImpl).m_Buffer.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)uVar1 + 4 <=
      (ulong)((long)(this->m_BufferImpl).m_Buffer.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar4)) {
    uVar2 = *(uint *)(puVar4 + uVar1);
    __new_size = (ulong)uVar2;
    (this->m_BufferImpl).m_Offset = uVar1 + 4;
    std::
    vector<ViconCGStreamDetail::VCameraCalibrationHealth_Camera,_std::allocator<ViconCGStreamDetail::VCameraCalibrationHealth_Camera>_>
    ::resize(o_rValues,__new_size);
    pVVar3 = (o_rValues->
             super__Vector_base<ViconCGStreamDetail::VCameraCalibrationHealth_Camera,_std::allocator<ViconCGStreamDetail::VCameraCalibrationHealth_Camera>_>
             )._M_impl.super__Vector_impl_data._M_start;
    this_00 = (VCameraCalibrationHealth_Camera *)0x0;
    if (pVVar3 != (o_rValues->
                  super__Vector_base<ViconCGStreamDetail::VCameraCalibrationHealth_Camera,_std::allocator<ViconCGStreamDetail::VCameraCalibrationHealth_Camera>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      this_00 = pVVar3;
    }
    if (uVar2 == 0) {
      return uVar2 == 0;
    }
    bVar5 = ViconCGStreamDetail::VCameraCalibrationHealth_Camera::Read
                      (this_00,(this->m_BufferImpl).m_rParent);
    if (bVar5) {
      do {
        this_00 = this_00 + 1;
        __new_size = __new_size - 1;
        bVar5 = __new_size == 0;
        if (bVar5) {
          return bVar5;
        }
        bVar6 = ViconCGStreamDetail::VCameraCalibrationHealth_Camera::Read
                          (this_00,(this->m_BufferImpl).m_rParent);
      } while (bVar6);
      return bVar5;
    }
  }
  return false;
}

Assistant:

bool Read( std::vector< T > & o_rValues ) const
  {
    o_rValues.clear();
    ViconCGStreamType::UInt32 Size = 0;
    if( !m_BufferImpl.ReadPod( Size ) )
    {
      return false;
    }
    o_rValues.resize( Size );
    return VBufferDetail< VIsPod< T >::Answer >::Read( m_BufferImpl, o_rValues.empty() ? 0 : &o_rValues[ 0 ], Size );
  }